

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
helics::core::anon_unknown_5::makeCLITypeApp(string *corestring,string *namestring)

{
  pointer phVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  string *option_description;
  HelicsConfigJSON *this;
  App *pAVar2;
  Option *this_00;
  string *in_RDX;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> in_RDI;
  App *networking;
  HelicsConfigJSON *fmtr;
  __single_object *app;
  string *in_stack_fffffffffffffbe8;
  App *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_fffffffffffffc20;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc28;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc70;
  undefined1 config_required;
  string *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  App *in_stack_fffffffffffffc90;
  helicsCLI11App *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e1;
  allocator<char> local_2b9 [25];
  helicsCLI11App *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  App *in_stack_fffffffffffffd70;
  allocator<char> local_269 [40];
  allocator<char> local_241 [33];
  App *in_stack_fffffffffffffde0;
  allocator<char> local_1f1 [40];
  allocator<char> local_1c9 [40];
  allocator<char> local_1a1 [40];
  allocator<char> local_179 [40];
  allocator<char> local_151 [33];
  App *local_130;
  allocator<char> local_121 [33];
  HelicsConfigJSON *local_100;
  undefined1 local_f1 [80];
  allocator<char> local_a1 [40];
  allocator<char> local_79 [40];
  allocator<char> local_51 [56];
  undefined1 local_19;
  string *local_18;
  
  config_required = (undefined1)((ulong)in_stack_fffffffffffffc70 >> 0x38);
  local_19 = 0;
  this_02 = in_RDI._M_head_impl;
  local_18 = in_RDX;
  std::make_unique<helics::helicsCLI11App,char_const(&)[20]>
            ((char (*) [20])in_stack_fffffffffffffc78);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x596df3);
  helicsCLI11App::remove_helics_specifics(in_stack_fffffffffffffd60);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x596e0a);
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::App::option_defaults(&phVar1->super_App);
  option_description = (string *)CLI::OptionDefaults::ignore_case((OptionDefaults *)variable,true);
  CLI::OptionDefaults::ignore_underscore((OptionDefaults *)option_description,true);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x596e59);
  CLI::App::allow_config_extras(&phVar1->super_App,ignore_all);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x596e75);
  CLI::App::allow_extras(&phVar1->super_App,true);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x596e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  CLI::App::set_config
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78,(bool)config_required);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_a1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_79);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_51);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x596fb7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  pAVar2 = (App *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&this_02->super_App,(string *)in_RDI._M_head_impl,variable,option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)(local_f1 + 0x28));
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            ((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             in_stack_fffffffffffffbf0);
  this = addJsonConfig(in_stack_fffffffffffffde0);
  local_100 = this;
  CLI::ConfigBase::maxLayers(&this->super_ConfigBase,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  HelicsConfigJSON::promoteSection
            ((HelicsConfigJSON *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_121);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x597151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  CLI::App::add_option_group<CLI::Option_group>(pAVar2,local_18,(string *)this);
  pAVar2 = CLI::App::immediate_callback
                     (in_stack_fffffffffffffbf0,SUB81((ulong)in_stack_fffffffffffffbe8 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_179);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_151);
  local_130 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&this_02->super_App,(string *)in_RDI._M_head_impl,variable,option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_1c9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&this_02->super_App,(string *)in_RDI._M_head_impl,variable,option_description
                      );
  __s = local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,in_stack_fffffffffffffc20);
  CLI::Option::envname((Option *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_241);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator(local_1f1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x597451);
  __a = local_269;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  pAVar2 = CLI::App::add_subcommand
                     (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      (string *)in_stack_fffffffffffffd60);
  CLI::App::fallthrough(pAVar2,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)local_269);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x597523);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  this_01 = &local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  pAVar2 = CLI::App::add_subcommand
                     (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      (string *)in_stack_fffffffffffffd60);
  CLI::App::fallthrough(pAVar2,true);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator(local_2b9);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> makeCLITypeApp(std::string& corestring, std::string& namestring)
    {
        auto app = std::make_unique<helicsCLI11App>("type extraction app");
        app->remove_helics_specifics();
        app->option_defaults()->ignore_case()->ignore_underscore();
        app->allow_config_extras(CLI::config_extras_mode::ignore_all);
        app->allow_extras();
        app->set_config("--config-file,--config", "");
        app->add_option("--name,--identifier", namestring);
        auto* fmtr = addJsonConfig(app.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
        auto* networking = app->add_option_group("network type")->immediate_callback();
        networking->add_option("--core", corestring);
        networking->add_option("--coretype,-t", corestring)->envname("HELICS_CORE_TYPE");
        app->add_subcommand("broker")->fallthrough();
        app->add_subcommand("core")->fallthrough();
        return app;
    }